

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::Event::armWhenWouldSleep(Event *this)

{
  EventLoop *pEVar1;
  EventLoop *pEVar2;
  EventPort *pEVar3;
  long in_FS_OFFSET;
  bool _kjCondition;
  Fault f;
  
  pEVar1 = this->loop;
  pEVar2 = *(EventLoop **)(in_FS_OFFSET + -0x28);
  _kjCondition = pEVar2 == (EventLoop *)0x0 || pEVar2 == pEVar1;
  if (pEVar2 != (EventLoop *)0x0 && pEVar2 != pEVar1) {
    Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[111]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x8df,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
               "_kjCondition,\"Event armed from different thread than it was created in.  You must use \" \"Executor to queue events cross-thread.\""
               ,&_kjCondition,
               (char (*) [111])
               "Event armed from different thread than it was created in.  You must use Executor to queue events cross-thread."
              );
    Debug::Fault::fatal(&f);
  }
  if (this->live == 0x1e366381) {
    if (this->prev == (Event **)0x0) {
      this->next = pEVar1->wouldSleepHead;
      this->prev = &pEVar1->wouldSleepHead;
      pEVar1->wouldSleepHead = this;
      if (this->next != (Event *)0x0) {
        this->next->prev = &this->next;
      }
      pEVar1 = this->loop;
      if (pEVar1->wouldSleepTail == this->prev) {
        pEVar1->wouldSleepTail = &this->next;
      }
      if (pEVar1->lastRunnableState == false) {
        pEVar3 = (pEVar1->port).ptr;
        if (pEVar3 != (EventPort *)0x0) {
          (*pEVar3->_vptr_EventPort[2])(pEVar3,1);
        }
        pEVar1->lastRunnableState = true;
      }
    }
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42],kj::SourceLocation&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x8e2,FAILED,(char *)0x0,"\"tried to arm Event after it was destroyed\", location",
             (char (*) [42])"tried to arm Event after it was destroyed",&this->location);
  Debug::Fault::fatal(&f);
}

Assistant:

void Event::armWhenWouldSleep() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "Executor to queue events cross-thread.");
  if (live != MAGIC_LIVE_VALUE) {
    ([this]() noexcept {
      KJ_FAIL_ASSERT("tried to arm Event after it was destroyed", location);
    })();
  }

  if (prev == nullptr) {
    next = loop.wouldSleepHead;
    prev = &loop.wouldSleepHead;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    if (loop.wouldSleepTail == prev) {
      loop.wouldSleepTail = &next;
    }

    loop.setRunnable(true);
  }
}